

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::
write_padded<fmt::v5::internal::arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::char_writer>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>
           *this,align_spec *spec,char_writer *f)

{
  byte bVar1;
  uint uVar2;
  long *plVar3;
  long lVar4;
  char __tmp;
  size_t __len_1;
  ulong __n;
  char_type *__s;
  char_type *pcVar5;
  size_t __len;
  ulong __n_00;
  
  uVar2 = spec->width_;
  if ((ulong)uVar2 < 2) {
    plVar3 = *(long **)this;
    lVar4 = plVar3[1];
    std::__cxx11::string::resize((ulong)plVar3,(char)lVar4 + '\x01');
    *(char_type *)(*plVar3 + lVar4) = f->value;
    return;
  }
  plVar3 = *(long **)this;
  lVar4 = plVar3[1];
  std::__cxx11::string::resize((ulong)plVar3,(char)lVar4 + (char)uVar2);
  __s = (char_type *)(lVar4 + *plVar3);
  bVar1 = (byte)spec->fill_;
  __n_00 = (ulong)uVar2 - 1;
  pcVar5 = __s;
  if (spec->align_ == ALIGN_CENTER) {
    __n = __n_00 >> 1;
    if (uVar2 != 2) {
      pcVar5 = __s + __n;
      memset(__s,(uint)bVar1,__n);
    }
    *pcVar5 = f->value;
    __n_00 = __n_00 - __n;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      memset(__s,(uint)bVar1,__n_00);
      __s[__n_00] = f->value;
      return;
    }
    *__s = f->value;
  }
  memset(pcVar5 + 1,(uint)bVar1,__n_00);
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }